

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int cycle_phi_p(bb_insn_t_conflict bb_insn)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  MIR_insn_t pMVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = *(ulong *)&bb_insn->insn->field_0x18;
  uVar3 = 0;
  if (((int)uVar2 == 0xba) && (uVar3 = 0, uVar2 >> 0x21 != 0)) {
    pMVar4 = bb_insn->insn + 1;
    bVar6 = true;
    uVar5 = 2;
    do {
      if ((pMVar4->data != (void *)0x0) &&
         (*(bb_t_conflict *)(*(long *)((long)pMVar4->data + 8) + 0x30) == bb_insn->bb)) break;
      bVar6 = uVar5 < uVar2 >> 0x20;
      lVar1 = (2 - (uVar2 >> 0x20)) + uVar5;
      uVar5 = uVar5 + 1;
      pMVar4 = (MIR_insn_t)&pMVar4->ops[0].u;
    } while (lVar1 != 2);
    uVar3 = (uint)bVar6;
  }
  return uVar3;
}

Assistant:

static int cycle_phi_p (bb_insn_t bb_insn) { /* we are not in pure SSA at this stage */
  ssa_edge_t se;
  if (bb_insn->insn->code != MIR_PHI) return FALSE;
  for (size_t i = 1; i < bb_insn->insn->nops; i++)
    if ((se = bb_insn->insn->ops[i].data) != NULL && se->def->bb == bb_insn->bb) return TRUE;
  return FALSE;
}